

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O0

void array_container_negation(array_container_t *src,bitset_container_t *dst)

{
  uint64_t uVar1;
  undefined4 *in_RSI;
  uint64_t *in_RDI;
  uint64_t card;
  uint16_t *list;
  
  list = (uint16_t *)0x10000;
  bitset_container_set_all((bitset_container_t *)0x167db0);
  if ((int)*in_RDI != 0) {
    uVar1 = bitset_clear_list(in_RDI,(uint64_t)in_RSI,list,0x167ddf);
    *in_RSI = (int)uVar1;
  }
  return;
}

Assistant:

void array_container_negation(const array_container_t *src,
                              bitset_container_t *dst) {
    uint64_t card = UINT64_C(1 << 16);
    bitset_container_set_all(dst);

    if (src->cardinality == 0) {
        return;
    }

    dst->cardinality = (int32_t)bitset_clear_list(dst->words, card, src->array,
                                                  (uint64_t)src->cardinality);
}